

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibrary.cpp
# Opt level: O2

FunctionSignature * __thiscall
Jinx::Impl::Library::CreateFunctionSignature
          (FunctionSignature *__return_storage_ptr__,Library *this,Visibility visibility,
          String *name)

{
  char *start;
  bool bVar1;
  Lexer lexer;
  Parser parser;
  __shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2> local_2a50;
  Lexer local_2a40;
  undefined1 local_29d8 [10664];
  
  std::__shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2> *)local_29d8,
             &this->m_runtime);
  start = (name->_M_dataplus)._M_p;
  Lexer::Lexer(&local_2a40,(SymbolTypeMap *)(local_29d8._0_8_ + 0x11b8),start,
               start + name->_M_string_length,name);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_29d8 + 8));
  bVar1 = Lexer::Execute(&local_2a40);
  if (bVar1) {
    std::__shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_2a50,&this->m_runtime);
    Parser::Parser((Parser *)local_29d8,(RuntimeIPtr *)&local_2a50,&local_2a40.m_symbolList,name);
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2a50._M_refcount);
    Parser::ParseFunctionSignature
              (__return_storage_ptr__,(Parser *)local_29d8,(visibility == Public) + Private,
               &this->m_name);
    Parser::~Parser((Parser *)local_29d8);
  }
  else {
    FunctionSignature::FunctionSignature(__return_storage_ptr__);
  }
  Lexer::~Lexer(&local_2a40);
  return __return_storage_ptr__;
}

Assistant:

inline_t FunctionSignature Library::CreateFunctionSignature(Visibility visibility, const String & name) const
	{
		Lexer lexer(m_runtime.lock()->GetSymbolTypeMap(), name.c_str(), name.c_str() + name.size(), name);
		if (!lexer.Execute())
			return FunctionSignature();
		Parser parser(m_runtime.lock(), lexer.GetSymbolList(), name);
		return parser.ParseFunctionSignature(visibility == Visibility::Public ? VisibilityType::Public : VisibilityType::Private, m_name);
	}